

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_load.cpp
# Opt level: O2

bool __thiscall OPNMIDIplay::LoadBank(OPNMIDIplay *this,FileAndMemReader *fr)

{
  OpnInstMeta *pOVar1;
  OpnInstMeta *pOVar2;
  undefined8 *puVar3;
  ushort uVar4;
  OPN2 *pOVar5;
  WOPNBank *pWVar6;
  undefined1 auVar7 [14];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [13];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  OpnTimbre *pOVar14;
  uint16_t uVar15;
  size_t __size;
  void *mem;
  WOPNFile *pWVar16;
  Bank *pBVar17;
  long lVar18;
  uint8_t *puVar19;
  uint8_t *puVar20;
  size_t i;
  ulong uVar21;
  long lVar22;
  string *psVar23;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [15];
  int err;
  OPNMIDIplay *local_70;
  undefined4 local_64;
  WOPNFile *local_60;
  BasicBankMap<OPN2::Bank> *local_58;
  ulong local_50;
  WOPNBank *local_48 [3];
  
  err = 0;
  if (fr->m_mp == (void *)0x0 && fr->m_fp == (FILE *)0x0) {
    psVar23 = &this->errorStringOut;
  }
  else {
    local_70 = this;
    __size = FileAndMemReader::fileSize(fr);
    FileAndMemReader::seek(fr,0,0);
    mem = malloc(__size);
    if (mem == (void *)0x0) {
      psVar23 = &local_70->errorStringOut;
    }
    else {
      FileAndMemReader::read(fr,(int)mem,(void *)0x1,__size);
      pWVar16 = WOPN_LoadBankFromMem(mem,__size,&err);
      free(mem);
      if (pWVar16 != (WOPNFile *)0x0) {
        pOVar5 = (local_70->m_synth).m_p;
        (pOVar5->m_insBankSetup).volumeModel = (uint)pWVar16->volume_model;
        auVar26 = ZEXT215(CONCAT11(pWVar16->lfo_freq,pWVar16->lfo_freq >> 3)) & DAT_001dc0c0._0_15_;
        auVar12._8_7_ = 0;
        auVar12._0_8_ = SUB158(ZEXT115(0) << 0x40,7);
        auVar13._10_5_ = 0;
        auVar13._0_10_ = SUB1510(auVar12 << 0x38,5);
        auVar11._1_12_ = SUB1512(auVar13 << 0x28,3);
        auVar11[0] = auVar26[1];
        auVar7._6_8_ = SUB148(ZEXT214(0) << 0x40,6);
        auVar7._4_2_ = auVar11._0_2_;
        auVar7._1_3_ = 0;
        auVar7[0] = auVar26[0];
        (pOVar5->m_insBankSetup).lfoEnable = (int)auVar7._0_8_;
        (pOVar5->m_insBankSetup).lfoFrequency = (int)((ulong)auVar7._0_8_ >> 0x20);
        (pOVar5->m_insBankSetup).chipType = (uint)pWVar16->chip_type;
        (pOVar5->m_insBankSetup).mt32defaults = false;
        (local_70->m_setup).VolumeModel = 0;
        (local_70->m_setup).lfoEnable = -1;
        (local_70->m_setup).lfoFrequency = -1;
        (local_70->m_setup).chipType = -1;
        local_58 = &pOVar5->m_insBanks;
        BasicBankMap<OPN2::Bank>::clear(local_58);
        local_64._0_2_ = pWVar16->banks_count_melodic;
        local_64._2_2_ = pWVar16->banks_count_percussion;
        local_48[0] = pWVar16->banks_melodic;
        local_48[1] = pWVar16->banks_percussive;
        local_60 = pWVar16;
        for (lVar18 = 0; pWVar16 = local_60, lVar18 != 2; lVar18 = lVar18 + 1) {
          local_50 = (ulong)*(ushort *)((long)&local_64 + lVar18 * 2);
          lVar25 = 0x51;
          for (uVar21 = 0; uVar21 != local_50; uVar21 = uVar21 + 1) {
            pWVar6 = local_48[lVar18];
            uVar4._0_1_ = pWVar6[uVar21].bank_midi_lsb;
            uVar4._1_1_ = pWVar6[uVar21].bank_midi_msb;
            pBVar17 = BasicBankMap<OPN2::Bank>::operator[]
                                (local_58,(ulong)uVar4 + (ulong)(lVar18 != 0) * 0x8000);
            puVar19 = pBVar17->ins[0].op[0].OPS[0].data + 6;
            puVar20 = (uint8_t *)(pWVar6->bank_name + lVar25);
            for (lVar22 = 0; lVar22 != 0x80; lVar22 = lVar22 + 1) {
              pOVar1 = pBVar17->ins + lVar22;
              puVar3 = (undefined8 *)((long)&pBVar17->ins[lVar22].op[1].noteOffset + 1);
              *puVar3 = 0;
              puVar3[1] = 0;
              pOVar14 = pBVar17->ins[lVar22].op;
              *(undefined8 *)(pOVar14[1].OPS[2].data + 2) = 0;
              *(undefined8 *)(pOVar14[1].OPS[3].data + 3) = 0;
              pOVar14 = pBVar17->ins[lVar22].op;
              pOVar14[1].OPS[0] = (uint8_t  [7])0x0;
              pOVar14[1].OPS[1].data[0] = '\0';
              *(undefined8 *)(pOVar14[1].OPS[1].data + 1) = 0;
              pOVar14 = pBVar17->ins[lVar22].op;
              *(undefined8 *)(pOVar14->OPS[2].data + 2) = 0;
              *(undefined8 *)(pOVar14->OPS[3].data + 3) = 0;
              pOVar2 = pBVar17->ins + lVar22;
              pOVar2->op[0].OPS[0] = (uint8_t  [7])0x0;
              pOVar2->op[0].OPS[1].data[0] = '\0';
              *(undefined8 *)(pOVar2->op[0].OPS[1].data + 1) = 0;
              pBVar17->ins[lVar22].drumTone = pWVar6[uVar21].ins[lVar22].percussion_key_number;
              pBVar17->ins[lVar22].flags = pWVar6[uVar21].ins[lVar22].inst_flags;
              pBVar17->ins[lVar22].op[0].fbalg = pWVar6[uVar21].ins[lVar22].fbalg;
              pBVar17->ins[lVar22].op[0].lfosens = pWVar6[uVar21].ins[lVar22].lfosens;
              pBVar17->ins[lVar22].op[0].noteOffset = pWVar6[uVar21].ins[lVar22].note_offset;
              pBVar17->ins[lVar22].midiVelocityOffset =
                   pWVar6[uVar21].ins[lVar22].midi_velocity_offset;
              for (lVar24 = 0; lVar24 != 0x1c; lVar24 = lVar24 + 7) {
                puVar19[lVar24 + -6] = puVar20[lVar24 + -6];
                puVar19[lVar24 + -5] = puVar20[lVar24 + -5];
                puVar19[lVar24 + -4] = puVar20[lVar24 + -4];
                puVar19[lVar24 + -3] = puVar20[lVar24 + -3];
                puVar19[lVar24 + -2] = puVar20[lVar24 + -2];
                puVar19[lVar24 + -1] = puVar20[lVar24 + -1];
                puVar19[lVar24] = puVar20[lVar24];
              }
              uVar8 = *(undefined8 *)pOVar1->op[0].OPS;
              uVar9 = *(undefined8 *)(pOVar1->op[0].OPS[1].data + 1);
              uVar10 = *(undefined8 *)(pOVar1->op[0].OPS[3].data + 3);
              *(undefined8 *)(pOVar1->op[1].OPS[2].data + 2) =
                   *(undefined8 *)(pOVar1->op[0].OPS[2].data + 2);
              *(undefined8 *)(pOVar1->op[1].OPS[3].data + 3) = uVar10;
              *(undefined8 *)pOVar1->op[1].OPS = uVar8;
              *(undefined8 *)(pOVar1->op[1].OPS[1].data + 1) = uVar9;
              uVar15 = pWVar6[uVar21].ins[lVar22].delay_off_ms;
              pOVar1->soundKeyOnMs = pWVar6[uVar21].ins[lVar22].delay_on_ms;
              pOVar1->soundKeyOffMs = uVar15;
              puVar19 = puVar19 + 0x4f;
              puVar20 = puVar20 + 0x48;
            }
            lVar25 = lVar25 + 0x2424;
          }
        }
        applySetup(local_70);
        WOPN_Free(pWVar16);
        return true;
      }
      psVar23 = &local_70->errorStringOut;
      switch(err) {
      case 1:
        break;
      case 2:
        break;
      case 3:
        break;
      case 4:
        break;
      case 5:
      }
    }
  }
  std::__cxx11::string::assign((char *)psVar23);
  return false;
}

Assistant:

bool OPNMIDIplay::LoadBank(FileAndMemReader &fr)
{
    int err = 0;
    WOPNFile *wopn = NULL;
    char *raw_file_data = NULL;
    size_t  fsize;
    if(!fr.isValid())
    {
        errorStringOut = "Custom bank: Invalid data stream!";
        return false;
    }

    // Read complete bank file into the memory
    fsize = fr.fileSize();
    fr.seek(0, FileAndMemReader::SET);
    // Allocate necessary memory block
    raw_file_data = (char*)malloc(fsize);
    if(!raw_file_data)
    {
        errorStringOut = "Custom bank: Out of memory before of read!";
        return false;
    }
    fr.read(raw_file_data, 1, fsize);

    // Parse bank file from the memory
    wopn = WOPN_LoadBankFromMem((void*)raw_file_data, fsize, &err);
    //Free the buffer no more needed
    free(raw_file_data);

    // Check for any erros
    if(!wopn)
    {
        switch(err)
        {
        case WOPN_ERR_BAD_MAGIC:
            errorStringOut = "Custom bank: Invalid magic!";
            return false;
        case WOPN_ERR_UNEXPECTED_ENDING:
            errorStringOut = "Custom bank: Unexpected ending!";
            return false;
        case WOPN_ERR_INVALID_BANKS_COUNT:
            errorStringOut = "Custom bank: Invalid banks count!";
            return false;
        case WOPN_ERR_NEWER_VERSION:
            errorStringOut = "Custom bank: Version is newer than supported by this library!";
            return false;
        case WOPN_ERR_OUT_OF_MEMORY:
            errorStringOut = "Custom bank: Out of memory!";
            return false;
        default:
            errorStringOut = "Custom bank: Unknown error!";
            return false;
        }
    }

    Synth &synth = *m_synth;
    synth.m_insBankSetup.volumeModel = wopn->volume_model;
    synth.m_insBankSetup.lfoEnable = (wopn->lfo_freq & 8) != 0;
    synth.m_insBankSetup.lfoFrequency = wopn->lfo_freq & 7;
    synth.m_insBankSetup.chipType = wopn->chip_type;
    // FIXME: Implement the bank-side flag to enable this
    synth.m_insBankSetup.mt32defaults = false;
    m_setup.VolumeModel = OPNMIDI_VolumeModel_AUTO;
    m_setup.lfoEnable = -1;
    m_setup.lfoFrequency = -1;
    m_setup.chipType = -1;

    synth.m_insBanks.clear();

    uint16_t slots_counts[2] = {wopn->banks_count_melodic, wopn->banks_count_percussion};
    WOPNBank *slots_src_ins[2] = { wopn->banks_melodic, wopn->banks_percussive };

    for(size_t ss = 0; ss < 2; ss++)
    {
        for(size_t i = 0; i < slots_counts[ss]; i++)
        {
            size_t bankno = (slots_src_ins[ss][i].bank_midi_msb * 256) +
                            (slots_src_ins[ss][i].bank_midi_lsb) +
                            (ss ? size_t(Synth::PercussionTag) : 0);
            Synth::Bank &bank = synth.m_insBanks[bankno];
            for(int j = 0; j < 128; j++)
            {
                OpnInstMeta &ins = bank.ins[j];
                std::memset(&ins, 0, sizeof(OpnInstMeta));
                WOPNInstrument &inIns = slots_src_ins[ss][i].ins[j];
                cvt_generic_to_FMIns(ins, inIns);
            }
        }
    }

    applySetup();

    WOPN_Free(wopn);

    return true;
}